

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void gl4cts::GLSL420Pack::Utils::prepareVariableStrings
               (SHADER_STAGES in_stage,VARIABLE_STORAGE in_storage,qualifierSet *in_qualifiers,
               GLchar *in_type_name,GLchar *in_variable_name,string *out_definition,
               string *out_reference)

{
  VARIABLE_FLAVOUR VVar1;
  GLchar *variable_name;
  string *variable_name_00;
  qualifierSet local_88;
  string local_70;
  string local_50;
  
  variable_name = in_variable_name;
  variable_name_00 = out_definition;
  VVar1 = getVariableFlavour(in_stage,in_storage,in_qualifiers);
  prepareQualifiersSet(&local_88,in_qualifiers,in_stage,in_storage);
  getVariableName_abi_cxx11_
            (&local_50,(Utils *)(ulong)in_stage,in_storage,(VARIABLE_STORAGE)in_variable_name,
             variable_name);
  getVariableDefinition_abi_cxx11_
            (&local_70,(Utils *)(ulong)VVar1,(VARIABLE_FLAVOUR)&local_88,
             (qualifierSet *)in_type_name,local_50._M_dataplus._M_p,(GLchar *)variable_name_00);
  std::__cxx11::string::operator=((string *)out_definition,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  getVariableReference_abi_cxx11_
            (&local_70,(Utils *)(ulong)VVar1,(VARIABLE_FLAVOUR)local_50._M_dataplus._M_p,
             in_type_name);
  std::__cxx11::string::operator=((string *)out_reference,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_88.
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Utils::prepareVariableStrings(Utils::SHADER_STAGES in_stage, Utils::VARIABLE_STORAGE in_storage,
								   const Utils::qualifierSet& in_qualifiers, const glw::GLchar* in_type_name,
								   const glw::GLchar* in_variable_name, std::string& out_definition,
								   std::string& out_reference)
{
	VARIABLE_FLAVOUR	flavour	= getVariableFlavour(in_stage, in_storage, in_qualifiers);
	const qualifierSet& qualifiers = prepareQualifiersSet(in_qualifiers, in_stage, in_storage);
	const std::string&  name	   = getVariableName(in_stage, in_storage, in_variable_name);

	out_definition = getVariableDefinition(flavour, qualifiers, in_type_name, name.c_str());
	out_reference  = getVariableReference(flavour, name.c_str());
}